

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O2

void __thiscall
duckdb::DialectCandidates::DialectCandidates
          (DialectCandidates *this,CSVStateMachineOptions *options)

{
  char *__args;
  vector<char,_std::allocator<char>_> *pvVar1;
  const_reference pvVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  vector<char,std::allocator<char>> *this_00;
  reference pvVar4;
  idx_t i;
  ulong uVar5;
  pointer pQVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<char> __l_00;
  initializer_list<char> __l_01;
  initializer_list<duckdb::QuoteRule> __l_02;
  initializer_list<duckdb::QuoteRule> __l_03;
  initializer_list<char> __l_04;
  allocator_type local_112;
  value_type local_111;
  vector<duckdb::QuoteRule,_true> *local_110;
  CSVStateMachineOptions *local_108;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  DialectCandidates *local_d8;
  vector<char,_true> *local_d0;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_c8;
  vector<duckdb::QuoteRule,_true> default_quote_rule;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [24];
  vector<char,_true> default_comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  default_delimiter;
  vector<duckdb::vector<char,_true>,_true> default_escape;
  vector<duckdb::vector<char,_true>,_true> default_quote;
  
  local_d0 = &this->comment_candidates;
  local_110 = &this->quote_rule_candidates;
  local_c8 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->quote_candidates_map;
  (this->quote_rule_candidates).super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quote_rule_candidates).super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->quote_rule_candidates).super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delim_candidates).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->comment_candidates).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->delim_candidates).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delim_candidates).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quote_candidates_map)._M_h._M_buckets = &(this->quote_candidates_map)._M_h._M_single_bucket
  ;
  (this->quote_candidates_map)._M_h._M_bucket_count = 1;
  (this->quote_candidates_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->quote_candidates_map)._M_h._M_element_count = 0;
  (this->quote_candidates_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->quote_candidates_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->quote_candidates_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_100 = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&this->escape_candidates_map;
  (this->escape_candidates_map)._M_h._M_buckets =
       &(this->escape_candidates_map)._M_h._M_single_bucket;
  (this->escape_candidates_map)._M_h._M_bucket_count = 1;
  (this->escape_candidates_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->escape_candidates_map)._M_h._M_element_count = 0;
  (this->escape_candidates_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->escape_candidates_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->escape_candidates_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_108 = options;
  GetDefaultQuote();
  GetDefaultEscape();
  GetDefaultQuoteRule();
  GetDefaultDelimiter_abi_cxx11_();
  GetDefaultComment();
  for (uVar5 = 0;
      uVar5 < (ulong)((long)default_quote_rule.
                            super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                            super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)default_quote_rule.
                           super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                           super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                           ._M_impl.super__Vector_impl_data._M_start); uVar5 = uVar5 + 1) {
    pvVar1 = &vector<duckdb::vector<char,_true>,_true>::get<true>(&default_escape,uVar5)->
              super_vector<char,_std::allocator<char>_>;
    pvVar2 = vector<duckdb::QuoteRule,_true>::get<true>(&default_quote_rule,uVar5);
    local_f8._M_dataplus._M_p._0_1_ = *pvVar2;
    pvVar3 = &::std::__detail::
              _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_100,(key_type *)&local_f8)->
              super_vector<char,_std::allocator<char>_>;
    ::std::vector<char,_std::allocator<char>_>::operator=(pvVar3,pvVar1);
  }
  if ((local_108->delimiter).set_by_user == false) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&default_delimiter.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  }
  else {
    ::std::__cxx11::string::string((string *)&local_f8,(string *)&(local_108->delimiter).value);
    __l._M_len = 1;
    __l._M_array = &local_f8;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_a8,__l,&local_112);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,local_a8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_a8);
    ::std::__cxx11::string::~string((string *)&local_f8);
  }
  if ((local_108->comment).set_by_user == true) {
    local_a8[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )(local_108->comment).value;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_a8;
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_f8,__l_00,(allocator_type *)&local_112)
    ;
    ::std::vector<char,_std::allocator<char>_>::_M_move_assign
              (&local_d0->super_vector<char,_std::allocator<char>_>,&local_f8);
    ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&local_f8);
  }
  else {
    ::std::vector<char,_std::allocator<char>_>::operator=
              (&local_d0->super_vector<char,_std::allocator<char>_>,
               &default_comment.super_vector<char,_std::allocator<char>_>);
  }
  if ((local_108->quote).set_by_user == false) {
    for (uVar5 = 0;
        uVar5 < (ulong)((long)default_quote_rule.
                              super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                              super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)default_quote_rule.
                             super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                             super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>
                             ._M_impl.super__Vector_impl_data._M_start); uVar5 = uVar5 + 1) {
      pvVar1 = &vector<duckdb::vector<char,_true>,_true>::get<true>(&default_quote,uVar5)->
                super_vector<char,_std::allocator<char>_>;
      pvVar2 = vector<duckdb::QuoteRule,_true>::get<true>(&default_quote_rule,uVar5);
      local_f8._M_dataplus._M_p._0_1_ = *pvVar2;
      pvVar3 = &::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_c8,(key_type *)&local_f8)->
                super_vector<char,_std::allocator<char>_>;
      ::std::vector<char,_std::allocator<char>_>::operator=(pvVar3,pvVar1);
    }
  }
  else {
    __args = &(local_108->quote).value;
    local_d8 = this;
    for (pQVar6 = default_quote_rule.
                  super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pQVar6 != default_quote_rule.
                  super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                  super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
                  super__Vector_impl_data._M_finish; pQVar6 = pQVar6 + 1) {
      local_a8[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )*__args;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_a8;
      ::std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_f8,__l_01,
                 (allocator_type *)&local_112);
      local_111 = *pQVar6;
      pvVar1 = &::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_c8,&local_111)->super_vector<char,_std::allocator<char>_>;
      ::std::vector<char,_std::allocator<char>_>::_M_move_assign(pvVar1,&local_f8);
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&local_f8);
    }
    if ((0x27 < (ulong)(byte)*__args) || ((0x8400000001U >> ((ulong)(byte)*__args & 0x3f) & 1) == 0)
       ) {
      local_f8._M_dataplus._M_p._0_1_ = QUOTES_RFC;
      this_00 = (vector<char,std::allocator<char>> *)
                ::std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_100,(key_type *)&local_f8);
      ::std::vector<char,std::allocator<char>>::emplace_back<char_const&>(this_00,__args);
    }
  }
  if ((local_108->escape).set_by_user == true) {
    if ((local_108->escape).value == '\0') {
      local_a8[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)local_a8;
      ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::vector
                ((vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)&local_f8,__l_03,
                 (allocator_type *)&local_112);
    }
    else {
      local_a8[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x1;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_a8;
      ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::vector
                ((vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)&local_f8,__l_02,
                 (allocator_type *)&local_112);
    }
    ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::_M_move_assign
              (&local_110->super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>,
               &local_f8);
    ::std::_Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::~_Vector_base
              ((_Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)&local_f8);
    local_a8[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )(local_108->escape).value;
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)local_a8;
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_f8,__l_04,(allocator_type *)&local_112)
    ;
    pvVar4 = vector<duckdb::QuoteRule,_true>::get<true>(local_110,0);
    local_111 = *pvVar4;
    pvVar1 = &::std::__detail::
              _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_100,&local_111)->super_vector<char,_std::allocator<char>_>;
    ::std::vector<char,_std::allocator<char>_>::_M_move_assign(pvVar1,&local_f8);
    ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&local_f8);
  }
  else {
    ::std::vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::operator=
              (&local_110->super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>,
               &default_quote_rule.
                super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>);
  }
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&default_comment);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&default_delimiter);
  ::std::_Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>::~_Vector_base
            ((_Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_> *)
             &default_quote_rule);
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&default_escape.
              super_vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>
            );
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&default_quote.
              super_vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>
            );
  return;
}

Assistant:

DialectCandidates::DialectCandidates(const CSVStateMachineOptions &options) {
	// assert that quotes escapes and rules have equal size
	const auto default_quote = GetDefaultQuote();
	const auto default_escape = GetDefaultEscape();
	const auto default_quote_rule = GetDefaultQuoteRule();
	const auto default_delimiter = GetDefaultDelimiter();
	const auto default_comment = GetDefaultComment();

	D_ASSERT(default_quote.size() == default_quote_rule.size() && default_quote_rule.size() == default_escape.size());
	// fill the escapes
	for (idx_t i = 0; i < default_quote_rule.size(); i++) {
		escape_candidates_map[static_cast<uint8_t>(default_quote_rule[i])] = default_escape[i];
	}

	if (options.delimiter.IsSetByUser()) {
		// user provided a delimiter: use that delimiter
		delim_candidates = {options.delimiter.GetValue()};
	} else {
		// no delimiter provided: try standard/common delimiters
		delim_candidates = default_delimiter;
	}
	if (options.comment.IsSetByUser()) {
		// user provided comment character: use that as a comment
		comment_candidates = {options.comment.GetValue()};
	} else {
		// no comment provided: try standard/common comments
		comment_candidates = default_comment;
	}
	if (options.quote.IsSetByUser()) {
		// user provided quote: use that quote rule
		for (auto &quote_rule : default_quote_rule) {
			quote_candidates_map[static_cast<uint8_t>(quote_rule)] = {options.quote.GetValue()};
		}
		// also add it as an escape rule
		if (!IsQuoteDefault(options.quote.GetValue())) {
			escape_candidates_map[static_cast<uint8_t>(QuoteRule::QUOTES_RFC)].emplace_back(options.quote.GetValue());
		}
	} else {
		// no quote rule provided: use standard/common quotes
		for (idx_t i = 0; i < default_quote_rule.size(); i++) {
			quote_candidates_map[static_cast<uint8_t>(default_quote_rule[i])] = {default_quote[i]};
		}
	}
	if (options.escape.IsSetByUser()) {
		// user provided escape: use that escape rule
		if (options.escape == '\0') {
			quote_rule_candidates = {QuoteRule::QUOTES_RFC};
		} else {
			quote_rule_candidates = {QuoteRule::QUOTES_OTHER};
		}
		escape_candidates_map[static_cast<uint8_t>(quote_rule_candidates[0])] = {options.escape.GetValue()};
	} else {
		// no escape provided: try standard/common escapes
		quote_rule_candidates = default_quote_rule;
	}
}